

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalMapping::clear_MappingType(CategoricalMapping *this)

{
  if (((this->_oneof_case_[0] == 2) || (this->_oneof_case_[0] == 1)) &&
     ((this->MappingType_).stringtoint64map_ != (StringToInt64Map *)0x0)) {
    (*(((this->MappingType_).stringtoint64map_)->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void CategoricalMapping::clear_MappingType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CategoricalMapping)
  switch (MappingType_case()) {
    case kStringToInt64Map: {
      delete MappingType_.stringtoint64map_;
      break;
    }
    case kInt64ToStringMap: {
      delete MappingType_.int64tostringmap_;
      break;
    }
    case MAPPINGTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = MAPPINGTYPE_NOT_SET;
}